

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,StringTree *params_9,ArrayPtr<const_char> *params_10,
          StringTree *params_11,ArrayPtr<const_char> *params_12)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pos;
  size_t result;
  size_t sVar5;
  long lVar6;
  size_t local_c8 [2];
  char *local_b8;
  size_t sStack_b0;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  String local_60;
  StringTree *local_48;
  StringTree *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_c8[0] = this->size_;
  local_c8[1] = params->size_;
  local_b8 = (params_1->text).content.ptr;
  sStack_b0 = params_2->size_;
  local_a8 = params_3->size_;
  sStack_a0 = params_4->size_;
  local_98 = params_5->size_;
  sStack_90 = params_6->size_;
  local_88 = params_7->size_;
  local_80 = params_8->ptr;
  local_78 = (params_9->text).content.ptr;
  local_70 = params_10->ptr;
  local_68 = (params_11->text).content.ptr;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_c8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  __return_storage_ptr__->size_ = sVar5;
  local_c8[0] = 0;
  local_c8[1] = 0;
  sVar5 = 0;
  local_80 = (char *)0x0;
  local_70 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_c8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  local_48 = params;
  local_40 = params_1;
  local_38 = params_3;
  heapString(&local_60,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  local_c8[0] = 1;
  local_c8[1] = 1;
  local_b8 = (char *)0x0;
  sStack_b0 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_98 = 0;
  sStack_90 = 0;
  sVar5 = 0;
  local_88 = 0;
  local_80 = (char *)0x1;
  local_78 = (char *)0x0;
  local_70 = (char *)0x1;
  local_68 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_c8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,this,local_48,(ArrayPtr<const_char> *)local_40,params_2,
             local_38,params_4,params_5,params_6,params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}